

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

TimerHolder __thiscall
Liby::EventLoop::runEvery(EventLoop *this,Timestamp *timestamp,BasicHandler *handler)

{
  pointer this_00;
  _Invoker_type in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TimerHolder TVar1;
  shared_ptr<Liby::Timer> local_1b0;
  anon_class_128_4_cd8dc2cd local_1a0;
  BasicHandler local_120;
  Timer local_100;
  Timer *local_c8;
  Timer *timer1;
  WeakTimerHolder weak_holder;
  undefined1 local_60 [8];
  Timer timer;
  BasicHandler *handler_local;
  Timestamp *timestamp_local;
  EventLoop *this_local;
  TimerHolder *holder;
  
  timer.handler_._M_invoker = in_RCX;
  Timer::Timer((Timer *)local_60);
  TimerHolder::TimerHolder((TimerHolder *)this,(Timer *)local_60);
  WeakTimerHolder::WeakTimerHolder((WeakTimerHolder *)&timer1,(TimerHolder *)this);
  local_c8 = TimerHolder::getTimer((TimerHolder *)this);
  local_1a0.this = (EventLoop *)timestamp;
  std::function<void_()>::function
            (&local_1a0.handler,(function<void_()> *)timer.handler_._M_invoker);
  WeakTimerHolder::WeakTimerHolder(&local_1a0.weak_holder,(WeakTimerHolder *)&timer1);
  Timestamp::Timestamp(&local_1a0.timestamp,(Timestamp *)handler);
  std::function<void()>::
  function<Liby::EventLoop::runEvery(Liby::Timestamp_const&,std::function<void()>const&)::__0,void>
            ((function<void()> *)&local_120,&local_1a0);
  Timer::Timer(&local_100,(Timestamp *)handler,&local_120);
  Timer::operator=(local_c8,&local_100);
  Timer::~Timer(&local_100);
  std::function<void_()>::~function(&local_120);
  runEvery(Liby::Timestamp_const&,std::function<void()>const&)::$_0::~__0((__0 *)&local_1a0);
  this_00 = std::unique_ptr<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_>::operator->
                      ((unique_ptr<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_> *)
                       (timestamp + 1));
  TimerHolder::getTimerPtr((TimerHolder *)&local_1b0);
  TimerQueue::insert(this_00,&local_1b0);
  std::shared_ptr<Liby::Timer>::~shared_ptr(&local_1b0);
  WeakTimerHolder::~WeakTimerHolder((WeakTimerHolder *)&timer1);
  Timer::~Timer((Timer *)local_60);
  TVar1.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar1.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TimerHolder)TVar1.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerHolder EventLoop::runEvery(const Timestamp &timestamp,
                                const BasicHandler &handler) {
    Timer timer;
    TimerHolder holder(timer);
    WeakTimerHolder weak_holder(holder);
    Timer &timer1 = holder.getTimer();
    timer1 = Timer(timestamp, [this, handler, weak_holder, timestamp] {
        if (!weak_holder.getWeakTimerPtr().expired()) {
            auto timer = weak_holder.getWeakTimerPtr().lock();
            timer->setTimeout(timestamp + Timestamp::now());
            tqueue_->insert(weak_holder.getWeakTimerPtr().lock());
            handler();
        }
    });
    tqueue_->insert(holder.getTimerPtr());
    return holder;
}